

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  pointer *__f;
  bool bVar1;
  int iVar2;
  istream *piVar3;
  size_type sVar4;
  ostream *poVar5;
  ulong uVar6;
  logic_error *this;
  Date DVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  invalid_argument *anon_var_0;
  int local_378;
  invalid_argument *local_370;
  int local_368;
  string local_360;
  reference local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *entry;
  const_iterator __end6;
  const_iterator __begin6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range6;
  undefined1 local_300 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entries;
  anon_class_16_1_e241f3bb predicate_1;
  shared_ptr<Node> condition_1;
  undefined1 local_2a0 [4];
  int count;
  anon_class_16_1_e241f3bb predicate;
  shared_ptr<Node> condition;
  string event;
  undefined1 local_250 [8];
  Date date;
  string command;
  istringstream is;
  string local_90 [8];
  string line;
  Database db;
  
  TestAll();
  Database::Database((Database *)((long)&line.field_2 + 8));
  std::__cxx11::string::string(local_90);
  do {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,local_90);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) {
      std::__cxx11::string::~string(local_90);
      Database::~Database((Database *)((long)&line.field_2 + 8));
      return 0;
    }
    std::__cxx11::istringstream::istringstream
              ((istringstream *)((long)&command.field_2 + 8),local_90,8);
    std::__cxx11::string::string((string *)&date.day);
    std::operator>>((istream *)(command.field_2._M_local_buf + 8),(string *)&date.day);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &date.day,"Add");
    if (bVar1) {
      DVar7 = ParseDate((istream *)(command.field_2._M_local_buf + 8));
      date.year = DVar7.day;
      local_250 = DVar7._0_8_;
      ParseEvent_abi_cxx11_
                ((string *)
                 &condition.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (istream *)(command.field_2._M_local_buf + 8));
      Database::Add((Database *)((long)&line.field_2 + 8),(Date *)local_250,
                    (string *)
                    &condition.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string
                ((string *)
                 &condition.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &date.day,"Print");
      if (bVar1) {
        Database::Print((Database *)((long)&line.field_2 + 8),(ostream *)&std::cout);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&date.day,"Del");
        if (bVar1) {
          ParseCondition((istream *)
                         &predicate.condition.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
          std::shared_ptr<Node>::shared_ptr
                    ((shared_ptr<Node> *)local_2a0,
                     (shared_ptr<Node> *)
                     &predicate.condition.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::function<bool(Date_const&,std::__cxx11::string_const&)>::function<main::__0&,void>
                    ((function<bool(Date_const&,std::__cxx11::string_const&)> *)
                     &condition_1.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (anon_class_16_1_e241f3bb *)local_2a0);
          iVar2 = Database::RemoveIf((Database *)((long)&line.field_2 + 8),
                                     (Predicate *)
                                     &condition_1.
                                      super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount);
          std::
          function<bool_(const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function((function<bool_(const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&condition_1.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
          poVar5 = std::operator<<((ostream *)&std::cout,"Removed ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
          poVar5 = std::operator<<(poVar5," entries");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          main::$_0::~__0((__0 *)local_2a0);
          std::shared_ptr<Node>::~shared_ptr
                    ((shared_ptr<Node> *)
                     &predicate.condition.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&date.day,"Find");
          if (bVar1) {
            ParseCondition((istream *)
                           &predicate_1.condition.
                            super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            __f = &entries.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::shared_ptr<Node>::shared_ptr
                      ((shared_ptr<Node> *)__f,
                       (shared_ptr<Node> *)
                       &predicate_1.condition.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::function<bool(Date_const&,std::__cxx11::string_const&)>::function<main::__1&,void>
                      ((function<bool(Date_const&,std::__cxx11::string_const&)> *)&__range6,
                       (anon_class_16_1_e241f3bb *)__f);
            Database::FindIf((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_300,(Database *)((long)&line.field_2 + 8),
                             (Predicate *)&__range6);
            std::
            function<bool_(const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::~function((function<bool_(const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                         *)&__range6);
            __end6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_300);
            entry = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_300);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end6,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&entry), bVar1) {
              local_340 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&__end6);
              poVar5 = std::operator<<((ostream *)&std::cout,(string *)local_340);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end6);
            }
            poVar5 = std::operator<<((ostream *)&std::cout,"Found ");
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_300);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar4);
            poVar5 = std::operator<<(poVar5," entries");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_300);
            main::$_1::~__1((__1 *)&entries.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::shared_ptr<Node>::~shared_ptr
                      ((shared_ptr<Node> *)
                       &predicate_1.condition.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&date.day,"Last");
            if (bVar1) {
              DVar7 = ParseDate((istream *)(command.field_2._M_local_buf + 8));
              local_378 = DVar7.day;
              anon_var_0 = DVar7._0_8_;
              local_370 = anon_var_0;
              local_368 = local_378;
              Database::Last_abi_cxx11_
                        (&local_360,(Database *)((long)&line.field_2 + 8),(Date *)&local_370);
              poVar5 = std::operator<<((ostream *)&std::cout,(string *)&local_360);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string((string *)&local_360);
            }
            else {
              uVar6 = std::__cxx11::string::empty();
              if ((uVar6 & 1) == 0) {
                this = (logic_error *)__cxa_allocate_exception(0x10);
                std::operator+(&local_3a8,"Unknown command: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &date.day);
                std::logic_error::logic_error(this,(string *)&local_3a8);
                __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&date.day);
    std::__cxx11::istringstream::~istringstream((istringstream *)(command.field_2._M_local_buf + 8))
    ;
  } while( true );
}

Assistant:

int main() {
    TestAll();

    Database db;

    for (string line; getline(cin, line); ) {
        istringstream is(line);

        string command;
        is >> command;

        if (command == "Add") {
            const auto date = ParseDate(is);
            const auto event = ParseEvent(is);

            db.Add(date, event);
        } else if (command == "Print") {
            db.Print(cout);
        } else if (command == "Del") {
            auto condition = ParseCondition(is);

            auto predicate = [condition](const Date& date, const string& event) {
                return condition->Evaluate(date, event);
            };

            int count = db.RemoveIf(predicate);

            cout << "Removed " << count << " entries" << endl;
        } else if (command == "Find") {
            auto condition = ParseCondition(is);

            auto predicate = [condition](const Date& date, const string& event) {
                return condition->Evaluate(date, event);
            };

            const auto entries = db.FindIf(predicate);

            for (const auto& entry : entries) {
                cout << entry << endl;
            }
            
            cout << "Found " << entries.size() << " entries" << endl;
        } else if (command == "Last") {
            try {
                cout << db.Last(ParseDate(is)) << endl;
            } catch (invalid_argument&) {
                cout << "No entries" << endl;
            }
        } else if (command.empty()) {
            continue;
        } else {
            throw logic_error("Unknown command: " + command);
        }
    }

    return 0;
}